

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O3

result<std::pair<toml::string,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
toml::detail::parse_ml_literal_string<std::vector<char,std::allocator<char>>>
          (result<std::pair<toml::string,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,detail *this,
          location<std::vector<char,_std::allocator<char>_>_> *loc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  const_iterator rollback;
  undefined8 uVar2;
  value_type *pvVar3;
  value_type *pvVar4;
  internal_error *piVar5;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_RCX;
  location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *extraout_RDX;
  location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *extraout_RDX_00;
  location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *extraout_RDX_01;
  location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *loc_00
  ;
  location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *extraout_RDX_02;
  location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *extraout_RDX_03;
  location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *plVar6
  ;
  location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *loc_01
  ;
  initializer_list<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  initializer_list<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_00;
  initializer_list<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_01;
  result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
  body;
  result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
  close;
  result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
  open;
  location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  inner_loc;
  result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
  token;
  allocator_type local_399;
  undefined1 local_398 [16];
  undefined1 local_388 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_378;
  string local_368;
  undefined1 local_348 [80];
  string local_2f8;
  string local_2d8;
  undefined1 local_2b8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_2a0;
  region<std::vector<char,_std::allocator<char>_>_> local_290;
  result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
  local_248;
  undefined1 local_1f8 [80];
  undefined1 local_1a8 [8];
  _Alloc_hider local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190 [5];
  location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_138;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e8;
  location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_d0;
  result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
  local_c8;
  result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
  local_78;
  
  rollback._M_current = *(char **)(this + 0x40);
  sequence<toml::detail::repeat<toml::detail::character<(char)39>,toml::detail::exactly<3ul>>,toml::detail::repeat<toml::detail::either<toml::detail::exclude<toml::detail::either<toml::detail::in_range<(char)0,(char)8>,toml::detail::in_range<(char)16,(char)31>,toml::detail::character<(char)127>,toml::detail::repeat<toml::detail::character<(char)39>,toml::detail::exactly<3ul>>>>,toml::detail::either<toml::detail::character<(char)10>,toml::detail::sequence<toml::detail::character<(char)13>,toml::detail::character<(char)10>>>>,toml::detail::unlimited>,toml::detail::repeat<toml::detail::character<(char)39>,toml::detail::exactly<3ul>>>
  ::invoke<std::vector<char,std::allocator<char>>>
            (&local_c8,
             (sequence<toml::detail::repeat<toml::detail::character<(char)39>,toml::detail::exactly<3ul>>,toml::detail::repeat<toml::detail::either<toml::detail::exclude<toml::detail::either<toml::detail::in_range<(char)0,(char)8>,toml::detail::in_range<(char)16,(char)31>,toml::detail::character<(char)127>,toml::detail::repeat<toml::detail::character<(char)39>,toml::detail::exactly<3ul>>>>,toml::detail::either<toml::detail::character<(char)10>,toml::detail::sequence<toml::detail::character<(char)13>,toml::detail::character<(char)10>>>>,toml::detail::unlimited>,toml::detail::repeat<toml::detail::character<(char)39>,toml::detail::exactly<3ul>>>
              *)this,loc);
  if (local_c8.is_ok_ == true) {
    local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2f8,*(long *)(this + 0x20),
               *(long *)(this + 0x28) + *(long *)(this + 0x20));
    pvVar3 = result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
             ::unwrap(&local_c8);
    make_string<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>
              (&local_2d8,(detail *)(pvVar3->first_)._M_current,
               (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>)
               (pvVar3->last_)._M_current,
               (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>)
               in_RCX._M_current);
    location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    location(&local_138,&local_2f8,&local_2d8);
    plVar6 = extraout_RDX;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
      plVar6 = extraout_RDX_00;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
      operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
      plVar6 = extraout_RDX_01;
    }
    repeat<toml::detail::character<(char)39>,toml::detail::exactly<3ul>>::
    invoke<std::__cxx11::string>
              ((result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
                *)local_1f8,
               (repeat<toml::detail::character<(char)39>,toml::detail::exactly<3ul>> *)&local_138,
               plVar6);
    if (local_1f8[0] == false) {
      piVar5 = (internal_error *)__cxa_allocate_exception(0x28);
      local_348._0_8_ = local_348 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_348,"[error] parse_ml_literal_string: invalid token","");
      local_368._M_dataplus._M_p = (pointer)&local_138;
      std::
      pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<toml::detail::location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_const_char_(&)[14],_true>
                ((pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_1a8,
                 (location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  **)&local_368,(char (*) [14])"should be \'\'\'");
      __l_00._M_len = 1;
      __l_00._M_array = (iterator)local_1a8;
      std::
      vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::vector((vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&local_248,__l_00,(allocator_type *)&local_e8);
      local_398._0_8_ = (pointer)0x0;
      local_398._8_8_ = (pointer)0x0;
      local_388._0_8_ = (pointer)0x0;
      format_underline((string *)local_2b8,(string *)local_348,
                       (vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&local_248,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_398);
      internal_error::internal_error(piVar5,(string *)local_2b8);
      __cxa_throw(piVar5,&internal_error::typeinfo,internal_error::~internal_error);
    }
    either<toml::detail::character<(char)10>,toml::detail::sequence<toml::detail::character<(char)13>,toml::detail::character<(char)10>>>
    ::invoke<std::__cxx11::string>
              (&local_78,
               (either<toml::detail::character<(char)10>,toml::detail::sequence<toml::detail::character<(char)13>,toml::detail::character<(char)10>>>
                *)&local_138,loc_00);
    plVar6 = extraout_RDX_02;
    if (local_78.is_ok_ == true) {
      region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~region(&local_78.field_1.succ.value);
      plVar6 = extraout_RDX_03;
    }
    repeat<toml::detail::either<toml::detail::exclude<toml::detail::either<toml::detail::in_range<(char)0,(char)8>,toml::detail::in_range<(char)16,(char)31>,toml::detail::character<(char)127>,toml::detail::repeat<toml::detail::character<(char)39>,toml::detail::exactly<3ul>>>>,toml::detail::either<toml::detail::character<(char)10>,toml::detail::sequence<toml::detail::character<(char)13>,toml::detail::character<(char)10>>>>,toml::detail::unlimited>
    ::invoke<std::__cxx11::string>
              ((result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
                *)local_348,
               (repeat<toml::detail::either<toml::detail::exclude<toml::detail::either<toml::detail::in_range<(char)0,(char)8>,toml::detail::in_range<(char)16,(char)31>,toml::detail::character<(char)127>,toml::detail::repeat<toml::detail::character<(char)39>,toml::detail::exactly<3ul>>>>,toml::detail::either<toml::detail::character<(char)10>,toml::detail::sequence<toml::detail::character<(char)13>,toml::detail::character<(char)10>>>>,toml::detail::unlimited>
                *)&local_138,plVar6);
    repeat<toml::detail::character<(char)39>,toml::detail::exactly<3ul>>::
    invoke<std::__cxx11::string>
              (&local_248,
               (repeat<toml::detail::character<(char)39>,toml::detail::exactly<3ul>> *)&local_138,
               loc_01);
    if (local_248.is_ok_ == false) {
      piVar5 = (internal_error *)__cxa_allocate_exception(0x28);
      local_398._0_8_ = local_388;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_398,"[error] parse_ml_literal_string: invalid token","");
      local_d0 = &local_138;
      std::
      pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<toml::detail::location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_const_char_(&)[14],_true>
                ((pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_1a8,&local_d0,(char (*) [14])"should be \'\'\'");
      __l_01._M_len = 1;
      __l_01._M_array = (iterator)local_1a8;
      std::
      vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::vector((vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&local_368,__l_01,&local_399);
      local_e8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_e8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_e8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      format_underline((string *)local_2b8,(string *)local_398,
                       (vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&local_368,&local_e8);
      internal_error::internal_error(piVar5,(string *)local_2b8);
      __cxa_throw(piVar5,&internal_error::typeinfo,internal_error::~internal_error);
    }
    pvVar4 = result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
             ::unwrap((result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
                       *)local_348);
    make_string<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
              (&local_368,(detail *)(pvVar4->first_)._M_current,
               (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )(pvVar4->last_)._M_current,in_RCX);
    local_398[0] = literal;
    paVar1 = &local_368.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_368._M_dataplus._M_p == paVar1) {
      aStack_378._0_8_ = local_368.field_2._8_8_;
      local_398._8_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_388 + 8);
    }
    else {
      local_398._8_8_ = local_368._M_dataplus._M_p;
    }
    local_388._9_7_ = local_368.field_2._M_allocated_capacity._1_7_;
    local_388[8] = local_368.field_2._M_local_buf[0];
    local_388._0_8_ = local_368._M_string_length;
    local_368._M_string_length = 0;
    local_368.field_2._M_local_buf[0] = '\0';
    local_368._M_dataplus._M_p = (pointer)paVar1;
    pvVar3 = result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
             ::unwrap(&local_c8);
    std::pair<toml::string,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>::
    pair<toml::string,_true>
              ((pair<toml::string,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>
                *)local_2b8,(string *)local_398,pvVar3);
    std::pair<toml::string,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>::pair
              ((pair<toml::string,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>
                *)local_1a8,
               (pair<toml::string,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>
                *)local_2b8);
    __return_storage_ptr__->is_ok_ = true;
    std::pair<toml::string,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>::pair
              (&(__return_storage_ptr__->field_1).succ.value,
               (pair<toml::string,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>
                *)local_1a8);
    success<std::pair<toml::string,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>_>
    ::~success((success<std::pair<toml::string,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>_>
                *)local_1a8);
    region<std::vector<char,_std::allocator<char>_>_>::~region(&local_290);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._8_8_ != &aStack_2a0) {
      operator_delete((void *)local_2b8._8_8_,(ulong)(aStack_2a0._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_398._8_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_388 + 8)) {
      operator_delete((void *)local_398._8_8_,local_388._8_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_368._M_dataplus._M_p != paVar1) {
      operator_delete(local_368._M_dataplus._M_p,
                      CONCAT71(local_368.field_2._M_allocated_capacity._1_7_,
                               local_368.field_2._M_local_buf[0]) + 1);
    }
    if (local_248.is_ok_ == true) {
      region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~region(&local_248.field_1.succ.value);
    }
    if (local_348[0] == (string)0x1) {
      region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~region((region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)(local_348 + 8));
    }
    if (local_1f8[0] == true) {
      region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~region((region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)(local_1f8 + 8));
    }
    location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~location(&local_138);
  }
  else {
    location<std::vector<char,_std::allocator<char>_>_>::reset
              ((location<std::vector<char,_std::allocator<char>_>_> *)this,rollback);
    local_348._0_8_ = local_348 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_348,
               "[error] toml::parse_ml_literal_string: the next token is not a multiline literal string"
               ,"");
    local_1a8 = (undefined1  [8])this;
    local_1a0._M_p = (pointer)local_190;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,"here","");
    __l._M_len = 1;
    __l._M_array = (iterator)local_1a8;
    std::
    vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector((vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_248,__l,(allocator_type *)local_398);
    local_138.super_region_base._vptr_region_base = (_func_int **)0x0;
    local_138.source_.
    super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    local_138.source_.
    super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    format_underline((string *)local_1f8,(string *)local_348,
                     (vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&local_248,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_138);
    uVar2 = local_1f8._8_8_;
    local_2b8._0_8_ = local_2b8 + 0x10;
    if ((undefined1 *)local_1f8._0_8_ == local_1f8 + 0x10) {
      aStack_2a0._M_allocated_capacity = local_1f8._24_8_;
      local_1f8._0_8_ = local_2b8._0_8_;
    }
    local_2b8._17_7_ = local_1f8._17_7_;
    local_2b8[0x10] = local_1f8[0x10];
    local_1f8._8_8_ = (_func_int **)0x0;
    local_1f8[0x10] = '\0';
    __return_storage_ptr__->is_ok_ = false;
    paVar1 = &(__return_storage_ptr__->field_1).fail.value.field_2;
    *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      **)&__return_storage_ptr__->field_1 = paVar1;
    if (local_1f8._0_8_ == local_2b8._0_8_) {
      paVar1->_M_allocated_capacity = local_2b8._16_8_;
      *(size_type *)((long)&(__return_storage_ptr__->field_1).fail.value.field_2 + 8) =
           aStack_2a0._M_allocated_capacity;
    }
    else {
      (__return_storage_ptr__->field_1).fail.value._M_dataplus._M_p = (pointer)local_1f8._0_8_;
      (__return_storage_ptr__->field_1).fail.value.field_2._M_allocated_capacity = local_2b8._16_8_;
    }
    (__return_storage_ptr__->field_1).fail.value._M_string_length = uVar2;
    local_2b8._8_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    local_2b8._16_8_ = (ulong)(uint7)local_1f8._17_7_ << 8;
    local_1f8._0_8_ = local_1f8 + 0x10;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_138);
    std::
    vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector((vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_248);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._M_p != local_190) {
      operator_delete(local_1a0._M_p,local_190[0]._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_348._0_8_ != local_348 + 0x10) {
      operator_delete((void *)local_348._0_8_,(ulong)(local_348._16_8_ + 1));
    }
  }
  if (local_c8.is_ok_ == true) {
    region<std::vector<char,_std::allocator<char>_>_>::~region(&local_c8.field_1.succ.value);
  }
  return __return_storage_ptr__;
}

Assistant:

result<std::pair<toml::string, region<Container>>, std::string>
parse_ml_literal_string(location<Container>& loc)
{
    const auto first = loc.iter();
    if(const auto token = lex_ml_literal_string::invoke(loc))
    {
        location<std::string> inner_loc(loc.name(), token.unwrap().str());

        const auto open = lex_ml_literal_string_delim::invoke(inner_loc);
        if(!open)
        {
            throw internal_error(format_underline("[error] "
                "parse_ml_literal_string: invalid token",
                {{std::addressof(inner_loc), "should be '''"}}));
        }
        // immediate newline is ignored (if exists)
        /* discard return value */ lex_newline::invoke(inner_loc);

        const auto body = lex_ml_literal_body::invoke(inner_loc);

        const auto close = lex_ml_literal_string_delim::invoke(inner_loc);
        if(!close)
        {
            throw internal_error(format_underline("[error] "
                "parse_ml_literal_string: invalid token",
                {{std::addressof(inner_loc), "should be '''"}}));
        }
        return ok(std::make_pair(
                  toml::string(body.unwrap().str(), toml::string_t::literal),
                  token.unwrap()));
    }
    else
    {
        loc.reset(first); // rollback
        return err(format_underline("[error] toml::parse_ml_literal_string: "
                   "the next token is not a multiline literal string",
                   {{std::addressof(loc), "here"}}));
    }
}